

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

int __thiscall
re2::Compiler::CachedRuneByteSuffix(Compiler *this,uint8_t lo,uint8_t hi,bool foldcase,int next)

{
  int iVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  undefined7 in_register_00000009;
  undefined7 in_register_00000011;
  ulong uVar4;
  undefined7 in_register_00000031;
  uint64_t key;
  ulong local_38;
  
  uVar4 = CONCAT71(in_register_00000009,foldcase) & 0xffffffff;
  local_38 = uVar4 | ((ulong)(uint)((int)CONCAT71(in_register_00000031,lo) << 9) |
                     (long)next << 0x11) + (CONCAT71(in_register_00000011,hi) & 0xffffffff) * 2;
  iVar2 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->rune_cache_)._M_h,&local_38);
  if (iVar2.super__Node_iterator_base<std::pair<const_unsigned_long,_int>,_false>._M_cur ==
      (__node_type *)0x0) {
    iVar1 = UncachedRuneByteSuffix(this,lo,hi,SUB81(uVar4,0),next);
    pmVar3 = std::__detail::
             _Map_base<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_int>,_std::allocator<std::pair<const_unsigned_long,_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->rune_cache_,&local_38);
    *pmVar3 = iVar1;
  }
  else {
    iVar1 = *(int *)((long)iVar2.
                           super__Node_iterator_base<std::pair<const_unsigned_long,_int>,_false>.
                           _M_cur + 0x10);
  }
  return iVar1;
}

Assistant:

int Compiler::CachedRuneByteSuffix(uint8_t lo, uint8_t hi, bool foldcase,
                                   int next) {
  uint64_t key = MakeRuneCacheKey(lo, hi, foldcase, next);
  std::unordered_map<uint64_t, int>::const_iterator it = rune_cache_.find(key);
  if (it != rune_cache_.end())
    return it->second;
  int id = UncachedRuneByteSuffix(lo, hi, foldcase, next);
  rune_cache_[key] = id;
  return id;
}